

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

bool __thiscall ON_Brep::ChangeVertex(ON_Brep *this,int old_vi,int new_vi,bool bClearTolerances)

{
  ON_BrepVertex *pOVar1;
  int iVar2;
  int iVar3;
  ON_BrepVertex *pOVar4;
  ON_BrepVertex *pOVar5;
  int *piVar6;
  ON_BrepEdge *pOVar7;
  int local_84;
  ON_BrepTrim *local_60;
  ON_BrepTrim *trim;
  ON_BrepEdge *edge;
  int local_48;
  int ei;
  int tvi;
  int eti;
  int evi;
  int vei;
  ON_BrepVertex *new_v;
  ON_BrepVertex *old_v;
  int local_20;
  int iStack_1c;
  bool bClearTolerances_local;
  int new_vi_local;
  int old_vi_local;
  ON_Brep *this_local;
  
  if (old_vi == new_vi) {
    this_local._7_1_ = true;
  }
  else {
    old_v._7_1_ = bClearTolerances;
    local_20 = new_vi;
    iStack_1c = old_vi;
    _new_vi_local = this;
    new_v = Vertex(this,old_vi);
    _evi = Vertex(this,local_20);
    pOVar5 = new_v;
    if (new_v == (ON_BrepVertex *)0x0) {
      this_local._7_1_ = false;
    }
    else if (_evi == (ON_BrepVertex *)0x0) {
      this_local._7_1_ = false;
    }
    else if (new_v == _evi) {
      this_local._7_1_ = true;
    }
    else {
      pOVar4 = ON_ClassArray<ON_BrepVertex>::Array((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      pOVar1 = _evi;
      iStack_1c = (int)(((long)pOVar5 - (long)pOVar4) / 0x58);
      pOVar5 = ON_ClassArray<ON_BrepVertex>::Array((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      local_20 = (int)(((long)pOVar1 - (long)pOVar5) / 0x58);
      if (iStack_1c == local_20) {
        this_local._7_1_ = true;
      }
      else {
        for (eti = 0; iVar3 = eti, iVar2 = ON_SimpleArray<int>::Count(&new_v->m_ei), iVar3 < iVar2;
            eti = eti + 1) {
          piVar6 = ON_SimpleArray<int>::operator[](&new_v->m_ei,eti);
          edge._4_4_ = *piVar6;
          pOVar7 = Edge(this,edge._4_4_);
          if (pOVar7 != (ON_BrepEdge *)0x0) {
            if (pOVar7->m_vi[0] == new_v->m_vertex_index) {
              tvi = 0;
            }
            else {
              if (pOVar7->m_vi[1] != new_v->m_vertex_index) goto LAB_00575dac;
              tvi = 1;
            }
            ON_SimpleArray<int>::Append(&_evi->m_ei,(int *)((long)&edge + 4));
            pOVar7->m_vi[tvi] = local_20;
            if ((old_v._7_1_ & 1) != 0) {
              pOVar7->m_tolerance = -1.23432101234321e+308;
              _evi->m_tolerance = -1.23432101234321e+308;
            }
            for (ei = 0; iVar3 = ei, iVar2 = ON_SimpleArray<int>::Count(&pOVar7->m_ti),
                iVar3 < iVar2; ei = ei + 1) {
              piVar6 = ON_SimpleArray<int>::operator[](&pOVar7->m_ti,ei);
              local_60 = Trim(this,*piVar6);
              if (local_60 != (ON_BrepTrim *)0x0) {
                if ((local_60->m_bRev3d & 1U) == 0) {
                  local_84 = tvi;
                }
                else {
                  local_84 = 1 - tvi;
                }
                local_48 = local_84;
                local_60->m_vi[local_84] = local_20;
                do {
                  if (local_48 == 0) {
                    iVar3 = PrevTrim(this,local_60->m_trim_index);
                    local_60 = Trim(this,iVar3);
                  }
                  else {
                    if (local_48 != 1) break;
                    iVar3 = NextTrim(this,local_60->m_trim_index);
                    local_60 = Trim(this,iVar3);
                  }
                  if ((((local_60 == (ON_BrepTrim *)0x0) || (-1 < local_60->m_ei)) ||
                      (local_60->m_vi[1 - local_48] != iStack_1c)) ||
                     (local_60->m_vi[1 - local_48] = local_20, local_60->m_vi[local_48] != iStack_1c
                     )) break;
                  local_60->m_vi[local_48] = local_20;
                } while( true );
              }
            }
          }
LAB_00575dac:
        }
        ON_SimpleArray<int>::Destroy(&new_v->m_ei);
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Brep::ChangeVertex( int old_vi, int new_vi, bool bClearTolerances )
{
  if ( old_vi == new_vi )
    return true;

  ON_BrepVertex* old_v = Vertex(old_vi);
  ON_BrepVertex* new_v = Vertex(new_vi);
  
  if ( 0 == old_v )
    return false;
  if ( 0 == new_v )
    return false;
  if( old_v == new_v )
    return true;

  // clear type bits
  old_vi = (int)(old_v - m_V.Array()); // the (int) is for 64 bit size_t conversion
  new_vi = (int)(new_v - m_V.Array());
  if ( old_vi == new_vi )
    return true;

  int vei, evi, eti, tvi, ei;

  for ( vei = 0; vei < old_v->m_ei.Count(); vei++ )
  {
    ei = old_v->m_ei[vei];
    ON_BrepEdge* edge = Edge( ei );
    if ( 0 == edge )
      continue;
    // edges that start/end at the same vertex are listed twice in old_v->m_ei[].
    if ( edge->m_vi[0] == old_v->m_vertex_index )
      evi = 0;
    else if ( edge->m_vi[1] == old_v->m_vertex_index )
      evi = 1;
    else
      continue;

    // connect edge to new vertex
    new_v->m_ei.Append(ei);
    edge->m_vi[evi] = new_vi;
    if ( bClearTolerances )
    {
      edge->m_tolerance = ON_UNSET_VALUE;
      new_v->m_tolerance = ON_UNSET_VALUE;
    }

    for ( eti = 0; eti < edge->m_ti.Count(); eti++ )
    {
      ON_BrepTrim* trim = Trim( edge->m_ti[eti]);
      if ( 0 == trim )
        continue;
      tvi = trim->m_bRev3d ? 1-evi : evi;
      trim->m_vi[tvi] = new_vi;
      for(;;)
      {
        if ( 0 == tvi )
          trim = Trim(PrevTrim(trim->m_trim_index));
        else if ( 1 == tvi )
          trim = Trim(NextTrim(trim->m_trim_index));
        else
          break;

        if ( 0 == trim )
          break;

        if ( trim->m_ei >= 0 )
          break; // not singular

        if ( trim->m_vi[1-tvi] == old_vi )
          trim->m_vi[1-tvi] = new_vi;
        else
          break;

        if ( trim->m_vi[tvi] == old_vi )
          trim->m_vi[tvi] = new_vi;
        else
          break;
      }
    }
  }
  old_v->m_ei.Destroy();
  return true;
}